

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicohandler.cpp
# Opt level: O2

QVariant * __thiscall
QtIcoHandler::option(QVariant *__return_storage_ptr__,QtIcoHandler *this,ImageOption option)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  ICONDIRENTRY local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((option == ImageFormat) || (option == Size)) {
    local_28.bWidth = 0xaa;
    local_28.bHeight = 0xaa;
    local_28.bColorCount = 0xaa;
    local_28.bReserved = 0xaa;
    local_28.wPlanes.val = 0xaaaa;
    local_28.wBitCount.val = 0xaaaa;
    local_28.dwBytesInRes.val = 0xaaaaaaaa;
    local_28.dwImageOffset.val = 0xaaaaaaaa;
    bVar2 = ICOReader::readIconEntry(this->m_pICOReader,this->m_currentIconIndex,&local_28);
    if (bVar2) {
      if (option == ImageFormat) {
        if (local_28.wBitCount.val == 0x20) {
          iVar1 = 5;
        }
        else if (local_28.wBitCount.val == 0x18) {
          iVar1 = 4;
        }
        else if (local_28.wBitCount.val == 2) {
          iVar1 = 1;
        }
        else {
          iVar1 = 3;
        }
        QVariant::QVariant(__return_storage_ptr__,iVar1);
        goto LAB_0010555f;
      }
      if (option == Size) {
        uVar3 = (ulong)local_28._0_8_ >> 8 & 0xff;
        uVar4 = 0x10000000000;
        if (uVar3 != 0) {
          uVar4 = uVar3 << 0x20;
        }
        uVar3 = 0x100;
        if ((local_28._0_8_ & 0xff) != 0) {
          uVar3 = local_28._0_8_ & 0xff;
        }
        QVariant::QVariant(__return_storage_ptr__,(QSize)(uVar3 | uVar4));
        goto LAB_0010555f;
      }
    }
  }
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
LAB_0010555f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QtIcoHandler::option(ImageOption option) const
{
    if (option == Size || option == ImageFormat) {
        ICONDIRENTRY iconEntry;
        if (m_pICOReader->readIconEntry(m_currentIconIndex, &iconEntry)) {
            switch (option) {
                case Size:
                    return QSize(iconEntry.bWidth ? iconEntry.bWidth : 256,
                                iconEntry.bHeight ? iconEntry.bHeight : 256);

                case ImageFormat:
                    switch (iconEntry.wBitCount) {
                        case 2:
                            return QImage::Format_Mono;
                        case 24:
                            return QImage::Format_RGB32;
                        case 32:
                            return QImage::Format_ARGB32;
                        default:
                            return QImage::Format_Indexed8;
                    }
                    break;
                default:
                    break;
            }
        }
    }
    return QVariant();
}